

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O1

size_t duckdb_je_eset_nextents_get(eset_t *eset,pszind_t pind)

{
  return eset->bin_stats[pind].nextents.repr;
}

Assistant:

size_t
eset_nextents_get(eset_t *eset, pszind_t pind) {
	return atomic_load_zu(&eset->bin_stats[pind].nextents, ATOMIC_RELAXED);
}